

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::FlattenParameter::MergePartialFromCodedStream(FlattenParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  UnknownFieldSet *unknown_fields;
  uint tag;
  ulong uVar7;
  bool bVar8;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003af802;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003af802:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    tag = (uint)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_003af890:
      iVar6 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar8 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar6 = 6;
        if (bVar8) goto LAB_003af8c6;
      }
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar7 != '\x10') goto LAB_003af890;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar7 = (ulong)bVar1;
          uVar4 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003af900;
          input->buffer_ = pbVar2 + 1;
          bVar8 = true;
        }
        else {
          uVar4 = 0;
LAB_003af900:
          uVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          bVar8 = -1 < (long)uVar7;
        }
        iVar6 = 6;
        if (bVar8) {
          this->end_axis_ = (int32)uVar7;
          goto LAB_003af8c6;
        }
        goto LAB_003af8c8;
      }
      if ((uVar5 != 1) || ((char)uVar7 != '\b')) goto LAB_003af890;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar7 = (ulong)bVar1;
        uVar4 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003af8e1;
        input->buffer_ = pbVar2 + 1;
        bVar8 = true;
      }
      else {
        uVar4 = 0;
LAB_003af8e1:
        uVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        bVar8 = -1 < (long)uVar7;
      }
      iVar6 = 6;
      if (bVar8) {
        this->axis_ = (int32)uVar7;
LAB_003af8c6:
        iVar6 = 0;
      }
    }
LAB_003af8c8:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool FlattenParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.FlattenParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 axis = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 end_axis = 2 [default = -1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_end_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &end_axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.FlattenParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.FlattenParameter)
  return false;
#undef DO_
}